

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Promise<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_> __thiscall
kj::anon_unknown_36::HttpInputStreamImpl::readHeader
          (HttpInputStreamImpl *this,HeaderType type,size_t bufferStart,size_t bufferEnd)

{
  Coroutine<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_> *this_00;
  PromiseAwaiter<unsigned_long> *__return_storage_ptr__;
  FixVoid<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_> *value;
  FixVoid<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_> *value_00;
  DebugComparison<unsigned_long_&,_unsigned_long_&> *params;
  ulong *puVar1;
  ulong *puVar2;
  Promise<unsigned_long> *promise;
  undefined8 *puVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  PromiseNode *pPVar7;
  PromiseArenaMember *pPVar8;
  ulong uVar9;
  undefined8 uVar10;
  undefined8 *puVar11;
  long lVar12;
  size_t sVar13;
  SourceLocation location;
  coroutine_handle<void> coroutine;
  void *pvVar14;
  void *__dest;
  ulong uVar15;
  undefined4 in_register_00000034;
  undefined8 in_R8;
  long lVar16;
  long lVar17;
  unsigned_long uVar18;
  ulong uVar19;
  int iVar20;
  bool bVar21;
  Fault f;
  unsigned_long local_1f0;
  Exception local_1c0;
  
  coroutine._M_fr_ptr = operator_new(0x558);
  *(code **)coroutine._M_fr_ptr = readHeader;
  *(code **)((long)coroutine._M_fr_ptr + 8) = readHeader;
  this_00 = (Coroutine<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_> *)
            ((long)coroutine._M_fr_ptr + 0x10);
  *(int *)((long)coroutine._M_fr_ptr + 0x550) = (int)bufferStart;
  *(ulong *)((long)coroutine._M_fr_ptr + 0x540) = CONCAT44(in_register_00000034,type);
  *(size_t *)((long)coroutine._M_fr_ptr + 0x520) = bufferEnd;
  *(undefined8 *)((long)coroutine._M_fr_ptr + 0x528) = in_R8;
  local_1c0.ownFile.content.ptr =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  local_1c0.ownFile.content.size_ = 0x510815;
  local_1c0.ownFile.content.disposer = (ArrayDisposer *)0x4a000006bb;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_00642248;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_00642290;
  location.function = "readHeader";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0x6bb;
  location.columnNumber = 0x4a;
  kj::_::CoroutineBase::CoroutineBase
            ((CoroutineBase *)this_00,coroutine,
             (ExceptionOrValue *)((long)coroutine._M_fr_ptr + 0x98),location);
  __return_storage_ptr__ = (PromiseAwaiter<unsigned_long> *)((long)coroutine._M_fr_ptr + 0x278);
  value = (FixVoid<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_> *)
          ((long)coroutine._M_fr_ptr + 0x438);
  value_00 = (FixVoid<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_> *)
             ((long)coroutine._M_fr_ptr + 0x478);
  params = (DebugComparison<unsigned_long_&,_unsigned_long_&> *)((long)coroutine._M_fr_ptr + 0x4b8);
  puVar1 = (ulong *)((long)coroutine._M_fr_ptr + 0x520);
  puVar2 = (ulong *)((long)coroutine._M_fr_ptr + 0x528);
  promise = (Promise<unsigned_long> *)((long)coroutine._M_fr_ptr + 0x530);
  puVar3 = (undefined8 *)((long)coroutine._M_fr_ptr + 0x538);
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_00642248;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_00642290;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x98) = 0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x230) = 0;
  (this->super_HttpInputStream)._vptr_HttpInputStream = (_func_int **)this_00;
  do {
    *(unsigned_long *)((long)coroutine._M_fr_ptr + 0x548) = local_1f0;
    lVar5 = *(long *)((long)coroutine._M_fr_ptr + 0x540);
    *(undefined8 *)((long)coroutine._M_fr_ptr + 0x530) = 0;
    lVar6 = *(long *)(lVar5 + 0x40);
    if (lVar6 == 0) {
      uVar15 = *(ulong *)(lVar5 + 0x20);
      if (*puVar2 != uVar15) {
LAB_003a8508:
        if (*(int *)((long)coroutine._M_fr_ptr + 0x550) == 1) {
          uVar15 = *(long *)((long)coroutine._M_fr_ptr + 0x528) -
                   *(long *)((long)coroutine._M_fr_ptr + 0x520);
          *(ulong *)((long)coroutine._M_fr_ptr + 0x4e0) = uVar15;
          *(undefined8 **)((long)coroutine._M_fr_ptr + 0x4e8) =
               &(anonymous_namespace)::MAX_CHUNK_HEADER_SIZE;
          *(char **)((long)coroutine._M_fr_ptr + 0x4f0) = " <= ";
          *(undefined8 *)((long)coroutine._M_fr_ptr + 0x4f8) = 5;
          *(bool *)((long)coroutine._M_fr_ptr + 0x500) = uVar15 < 0x21;
          if (uVar15 >= 0x21) {
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_long_const&>&,char_const(&)[24]>
                      ((Fault *)&local_1c0,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                       ,0x6fe,FAILED,"bufferEnd - bufferStart <= MAX_CHUNK_HEADER_SIZE",
                       "_kjCondition,\"invalid HTTP chunk size\"",
                       (DebugComparison<unsigned_long,_const_unsigned_long_&> *)
                       ((long)coroutine._M_fr_ptr + 0x4e0),(char (*) [24])"invalid HTTP chunk size")
            ;
            kj::_::Debug::Fault::fatal((Fault *)&local_1c0);
          }
        }
        puVar11 = *(undefined8 **)(*(long *)((long)coroutine._M_fr_ptr + 0x540) + 0x10);
        (**(code **)*puVar11)
                  (puVar3,puVar11,
                   *(long *)((long)coroutine._M_fr_ptr + 0x528) +
                   *(long *)(*(long *)((long)coroutine._M_fr_ptr + 0x540) + 0x18),1);
        pPVar8 = &((promise->super_PromiseBase).node.ptr)->super_PromiseArenaMember;
        (promise->super_PromiseBase).node.ptr = (PromiseNode *)*puVar3;
        *puVar3 = 0;
        if (pPVar8 != (PromiseArenaMember *)0x0) {
          kj::_::PromiseDisposer::dispose(pPVar8);
        }
        pPVar8 = (PromiseArenaMember *)*puVar3;
        if (pPVar8 != (PromiseArenaMember *)0x0) {
          *puVar3 = 0;
          kj::_::PromiseDisposer::dispose(pPVar8);
        }
        goto LAB_003a85ef;
      }
      uVar4 = *(uint *)((long)coroutine._M_fr_ptr + 0x550);
      if (uVar4 == 0) {
        uVar19 = 0;
      }
      else {
        uVar19 = *(ulong *)(lVar5 + 0x30);
      }
      uVar9 = *(ulong *)((long)coroutine._M_fr_ptr + 0x520);
      if (uVar19 < uVar9) {
        memmove((void *)(*(long *)(lVar5 + 0x18) + uVar19),(void *)(*(long *)(lVar5 + 0x18) + uVar9)
                ,*puVar2 - uVar9);
        *puVar2 = (*puVar2 + uVar19) - *puVar1;
        *puVar1 = uVar19;
        iVar20 = 0;
        bVar21 = true;
      }
      else {
        if (uVar4 != 0) {
          kj::_::Debug::makeDescription<char_const(&)[24]>
                    ((String *)((long)coroutine._M_fr_ptr + 0x508),(Debug *)0x5108af,
                     "invalid HTTP chunk size",(char (*) [24])(ulong)uVar4);
          Exception::Exception
                    (&local_1c0,FAILED,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                     ,0x6e7,(String *)((long)coroutine._M_fr_ptr + 0x508));
          throwFatalException(&local_1c0,0);
        }
        if (uVar15 < 0x20000) {
          sVar13 = uVar15 * 2;
          pvVar14 = kj::_::HeapArrayDisposer::allocateImpl
                              (1,sVar13,sVar13,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0
                              );
          lVar5 = *(long *)((long)coroutine._M_fr_ptr + 0x540);
          *(void **)((long)coroutine._M_fr_ptr + 0x278) = pvVar14;
          *(size_t *)((long)coroutine._M_fr_ptr + 0x280) = sVar13;
          *(undefined8 **)((long)coroutine._M_fr_ptr + 0x288) = &kj::_::HeapArrayDisposer::instance;
          memcpy(pvVar14,*(void **)(lVar5 + 0x18),*(size_t *)(lVar5 + 0x20));
          lVar5 = *(long *)(lVar5 + 0x18);
          if (lVar5 != 0) {
            lVar6 = *(long *)((long)coroutine._M_fr_ptr + 0x540);
            uVar10 = *(undefined8 *)(lVar6 + 0x20);
            *(undefined8 *)(lVar6 + 0x18) = 0;
            *(undefined8 *)(lVar6 + 0x20) = 0;
            (**(code **)**(undefined8 **)(lVar6 + 0x28))
                      (*(undefined8 **)(lVar6 + 0x28),lVar5,1,uVar10,uVar10,0);
          }
          lVar5 = *(long *)((long)coroutine._M_fr_ptr + 0x540);
          *(undefined8 *)(lVar5 + 0x18) = *(undefined8 *)((long)coroutine._M_fr_ptr + 0x278);
          *(undefined8 *)(lVar5 + 0x20) = *(undefined8 *)((long)coroutine._M_fr_ptr + 0x280);
          *(undefined8 *)(lVar5 + 0x28) = *(undefined8 *)((long)coroutine._M_fr_ptr + 0x288);
          *(undefined8 *)&__return_storage_ptr__->super_PromiseAwaiterBase = 0;
          *(undefined8 *)((long)coroutine._M_fr_ptr + 0x280) = 0;
          iVar20 = 0;
          bVar21 = true;
        }
        else {
          *(undefined8 *)((long)coroutine._M_fr_ptr + 0x468) = 0;
          *(undefined8 *)((long)coroutine._M_fr_ptr + 0x470) = 0;
          *(undefined4 *)((long)coroutine._M_fr_ptr + 0x438) = 2;
          *(undefined4 *)((long)coroutine._M_fr_ptr + 0x440) = 0x1af;
          *(char **)((long)coroutine._M_fr_ptr + 0x448) = "Request Header Fields Too Large";
          *(undefined8 *)((long)coroutine._M_fr_ptr + 0x450) = 0x20;
          *(char **)((long)coroutine._M_fr_ptr + 0x458) = "header too large.";
          *(undefined8 *)((long)coroutine._M_fr_ptr + 0x460) = 0x12;
          kj::_::Coroutine<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_>::fulfill
                    (this_00,value);
          if (value->tag == 1) {
            value->tag = 0;
          }
          iVar20 = 3;
          if (value->tag == 2) {
            value->tag = 0;
          }
          bVar21 = false;
        }
      }
      if (bVar21) goto LAB_003a8508;
    }
    else {
      bVar21 = *(long *)((long)coroutine._M_fr_ptr + 0x520) ==
               *(long *)((long)coroutine._M_fr_ptr + 0x528);
      *(ulong **)((long)coroutine._M_fr_ptr + 0x4b8) = puVar1;
      *(ulong **)((long)coroutine._M_fr_ptr + 0x4c0) = puVar2;
      *(char **)((long)coroutine._M_fr_ptr + 0x4c8) = " == ";
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x4d0) = 5;
      *(bool *)((long)coroutine._M_fr_ptr + 0x4d8) = bVar21;
      if (!bVar21) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long&>&>
                  ((Fault *)&local_1c0,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                   ,0x6cc,FAILED,"bufferStart == bufferEnd","_kjCondition,",params);
        kj::_::Debug::Fault::fatal((Fault *)&local_1c0);
      }
      uVar15 = *(long *)(lVar5 + 0x38) - *(long *)(lVar5 + 0x18);
      *puVar1 = uVar15;
      *puVar2 = uVar15;
      *(long *)&__return_storage_ptr__->super_PromiseAwaiterBase = lVar6;
      kj::_::PromiseDisposer::
      alloc<kj::_::ImmediatePromiseNode<unsigned_long>,kj::_::PromiseDisposer,unsigned_long>
                ((PromiseDisposer *)params,(unsigned_long *)__return_storage_ptr__);
      pPVar7 = (PromiseNode *)params->left;
      params->left = (unsigned_long *)0x0;
      pPVar8 = &((promise->super_PromiseBase).node.ptr)->super_PromiseArenaMember;
      (promise->super_PromiseBase).node.ptr = pPVar7;
      if (pPVar8 != (PromiseArenaMember *)0x0) {
        kj::_::PromiseDisposer::dispose(pPVar8);
      }
      lVar5 = *(long *)((long)coroutine._M_fr_ptr + 0x540);
      *(undefined8 *)(lVar5 + 0x38) = 0;
      *(undefined8 *)(lVar5 + 0x40) = 0;
LAB_003a85ef:
      co_await<unsigned_long>(__return_storage_ptr__,promise);
      *(undefined1 *)((long)coroutine._M_fr_ptr + 0x554) = 0;
      bVar21 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                         ((PromiseAwaiterBase *)__return_storage_ptr__,(CoroutineBase *)this_00);
      if (bVar21) {
        return (PromiseBase)(PromiseBase)this;
      }
      local_1f0 = kj::_::PromiseAwaiter<unsigned_long>::await_resume(__return_storage_ptr__);
      if (*(char *)((long)coroutine._M_fr_ptr + 0x290) == '\x01') {
        Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 0x298));
      }
      kj::_::PromiseAwaiterBase::~PromiseAwaiterBase((PromiseAwaiterBase *)__return_storage_ptr__);
      uVar18 = local_1f0;
      if (*(char *)(*(long *)((long)coroutine._M_fr_ptr + 0x540) + 0xd0) == '\x01') {
        uVar15 = *puVar2;
        if ((uVar15 == *puVar1) &&
           (*(char *)(*(long *)(*(long *)((long)coroutine._M_fr_ptr + 0x540) + 0x18) + uVar15) ==
            '\r')) {
          *puVar2 = uVar15 + 1;
          uVar18 = local_1f0 - 1;
        }
        if (uVar18 == 0) {
          uVar18 = 0;
        }
        else {
          lVar5 = *(long *)((long)coroutine._M_fr_ptr + 0x528);
          if (*(char *)(*(long *)(*(long *)((long)coroutine._M_fr_ptr + 0x540) + 0x18) + lVar5) ==
              '\n') {
            *(undefined1 *)(*(long *)((long)coroutine._M_fr_ptr + 0x540) + 0xd0) = 0;
            uVar15 = lVar5 + 1;
            *puVar2 = uVar15;
            uVar18 = uVar18 - 1;
            *puVar1 = uVar15;
          }
        }
        if (uVar18 == 0) {
          iVar20 = 5;
          goto LAB_003a88f4;
        }
      }
      uVar15 = *puVar2;
      uVar19 = uVar18 + uVar15;
      do {
        lVar5 = *(long *)((long)coroutine._M_fr_ptr + 0x540);
        lVar6 = *(long *)(lVar5 + 0x18);
        pvVar14 = memchr((void *)(lVar6 + uVar15),10,uVar19 - uVar15);
        if (pvVar14 == (void *)0x0) {
          *puVar2 = uVar19;
          iVar20 = 0xc;
        }
        else if ((*(int *)((long)coroutine._M_fr_ptr + 0x550) == 1) ||
                ((3 < (long)pvVar14 - lVar6 &&
                 ((*(char *)((long)pvVar14 + -1) == '\n' ||
                  ((*(char *)((long)pvVar14 + -1) == '\r' && (*(char *)((long)pvVar14 + -2) == '\n')
                   ))))))) {
          lVar17 = (long)pvVar14 + (~(ulong)(*(char *)((long)pvVar14 + -1) == '\r') - lVar6) + 1;
          if (*(int *)((long)coroutine._M_fr_ptr + 0x550) == 0) {
            if (*(long *)(lVar5 + 0x20) - uVar19 < 0x20) {
              sVar13 = *(long *)(lVar5 + 0x20) * 2;
              __dest = kj::_::HeapArrayDisposer::allocateImpl
                                 (1,sVar13,sVar13,(_func_void_void_ptr *)0x0,
                                  (_func_void_void_ptr *)0x0);
              lVar5 = *(long *)((long)coroutine._M_fr_ptr + 0x540);
              *(void **)((long)coroutine._M_fr_ptr + 0x278) = __dest;
              *(size_t *)((long)coroutine._M_fr_ptr + 0x280) = sVar13;
              *(undefined8 **)((long)coroutine._M_fr_ptr + 0x288) =
                   &kj::_::HeapArrayDisposer::instance;
              memcpy(__dest,*(void **)(lVar5 + 0x18),*(size_t *)(lVar5 + 0x20));
              lVar5 = *(long *)(lVar5 + 0x18);
              if (lVar5 != 0) {
                lVar12 = *(long *)((long)coroutine._M_fr_ptr + 0x540);
                *(undefined8 *)(lVar12 + 0x18) = 0;
                *(undefined8 *)(lVar12 + 0x20) = 0;
                (**(code **)**(undefined8 **)(lVar12 + 0x28))
                          (*(undefined8 **)(lVar12 + 0x28),lVar5,1);
              }
              lVar5 = *(long *)((long)coroutine._M_fr_ptr + 0x540);
              *(undefined8 *)(lVar5 + 0x18) = *(undefined8 *)((long)coroutine._M_fr_ptr + 0x278);
              *(undefined8 *)(lVar5 + 0x20) = *(undefined8 *)((long)coroutine._M_fr_ptr + 0x280);
              *(undefined8 *)(lVar5 + 0x28) = *(undefined8 *)((long)coroutine._M_fr_ptr + 0x288);
              *(undefined8 *)&__return_storage_ptr__->super_PromiseAwaiterBase = 0;
              *(undefined8 *)((long)coroutine._M_fr_ptr + 0x280) = 0;
            }
            *(long *)(*(long *)((long)coroutine._M_fr_ptr + 0x540) + 0x30) = lVar17;
          }
          else {
            *(undefined1 *)(lVar5 + 0xd0) = 1;
          }
          lVar16 = (long)pvVar14 + (1 - lVar6);
          lVar5 = *(long *)((long)coroutine._M_fr_ptr + 0x520);
          lVar6 = *(long *)((long)coroutine._M_fr_ptr + 0x540);
          lVar12 = *(long *)(lVar6 + 0x18);
          *(long *)(lVar6 + 0x38) = lVar12 + lVar16;
          *(ulong *)(lVar6 + 0x40) = uVar19 - lVar16;
          *(undefined4 *)((long)coroutine._M_fr_ptr + 0x478) = 1;
          *(long *)((long)coroutine._M_fr_ptr + 0x480) = lVar12 + lVar5;
          *(long *)((long)coroutine._M_fr_ptr + 0x488) = lVar17 - lVar5;
          kj::_::Coroutine<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_>::fulfill
                    (this_00,value_00);
          if (value_00->tag == 1) {
            value_00->tag = 0;
          }
          iVar20 = 3;
          if (value_00->tag == 2) {
            value_00->tag = 0;
          }
        }
        else {
          uVar15 = ((long)pvVar14 - lVar6) + 1;
          iVar20 = 0;
        }
      } while (iVar20 == 0);
      if (iVar20 == 0xc) {
        iVar20 = 0;
      }
    }
LAB_003a88f4:
    pPVar8 = &((promise->super_PromiseBase).node.ptr)->super_PromiseArenaMember;
    if (pPVar8 != (PromiseArenaMember *)0x0) {
      (promise->super_PromiseBase).node.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(pPVar8);
    }
    if ((iVar20 != 0) && (iVar20 != 5)) {
      if (iVar20 == 3) {
        *(undefined8 *)coroutine._M_fr_ptr = 0;
        *(undefined1 *)((long)coroutine._M_fr_ptr + 0x554) = 1;
      }
      else {
        if (*(char *)((long)coroutine._M_fr_ptr + 0x230) == '\x01') {
          if (*(int *)((long)coroutine._M_fr_ptr + 0x238) == 1) {
            *(undefined4 *)((long)coroutine._M_fr_ptr + 0x238) = 0;
          }
          if (*(int *)((long)coroutine._M_fr_ptr + 0x238) == 2) {
            *(undefined4 *)((long)coroutine._M_fr_ptr + 0x238) = 0;
          }
        }
        if ((((ExceptionOrValue *)((long)coroutine._M_fr_ptr + 0x98))->exception).ptr.isSet == true)
        {
          Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 0xa0));
        }
        kj::_::CoroutineBase::~CoroutineBase((CoroutineBase *)this_00);
        operator_delete(coroutine._M_fr_ptr,0x558);
      }
      return (PromiseBase)(PromiseBase)this;
    }
  } while( true );
}

Assistant:

kj::Promise<kj::OneOf<kj::ArrayPtr<char>, HttpHeaders::ProtocolError>> readHeader(
      HeaderType type, size_t bufferStart, size_t bufferEnd) {
    // Reads the HTTP message header or a chunk header (as in transfer-encoding chunked) and
    // returns the buffer slice containing it.
    //
    // The main source of complication here is that we want to end up with one continuous buffer
    // containing the result, and that the input is delimited by newlines rather than by an upfront
    // length.

    for (;;) {
      kj::Promise<size_t> readPromise = nullptr;

      // Figure out where we're reading from.
      if (leftover != nullptr) {
        // Some data is still left over from the previous message, so start with that.

        // This can only happen if this is the initial run through the loop.
        KJ_ASSERT(bufferStart == bufferEnd);

        // OK, set bufferStart and bufferEnd to both point to the start of the leftover, and then
        // fake a read promise as if we read the bytes from the leftover.
        bufferStart = leftover.begin() - headerBuffer.begin();
        bufferEnd = bufferStart;
        readPromise = leftover.size();
        leftover = nullptr;
      } else {
        // Need to read more data from the underlying stream.

        if (bufferEnd == headerBuffer.size()) {
          // Out of buffer space.

          // Maybe we can move bufferStart backwards to make more space at the end?
          size_t minStart = type == HeaderType::MESSAGE ? 0 : messageHeaderEnd;

          if (bufferStart > minStart) {
            // Move to make space.
            memmove(headerBuffer.begin() + minStart, headerBuffer.begin() + bufferStart,
                    bufferEnd - bufferStart);
            bufferEnd = bufferEnd - bufferStart + minStart;
            bufferStart = minStart;
          } else {
            // Really out of buffer space. Grow the buffer.
            if (type != HeaderType::MESSAGE) {
              // Can't grow because we'd invalidate the HTTP headers.
              kj::throwFatalException(KJ_EXCEPTION(FAILED, "invalid HTTP chunk size"));
            }
            if (headerBuffer.size() >= MAX_BUFFER) {
              co_return HttpHeaders::ProtocolError {
                  .statusCode = 431,
                  .statusMessage = "Request Header Fields Too Large",
                  .description = "header too large.",
                  .rawContent = nullptr };
            }
            auto newBuffer = kj::heapArray<char>(headerBuffer.size() * 2);
            memcpy(newBuffer.begin(), headerBuffer.begin(), headerBuffer.size());
            headerBuffer = kj::mv(newBuffer);
          }
        }

        // How many bytes will we read?
        size_t maxBytes = headerBuffer.size() - bufferEnd;

        if (type == HeaderType::CHUNK) {
          // Roughly limit the amount of data we read to MAX_CHUNK_HEADER_SIZE.
          // TODO(perf): This is mainly to avoid copying a lot of body data into our buffer just to
          //   copy it again when it is read. But maybe the copy would be cheaper than overhead of
          //   extra event loop turns?
          KJ_REQUIRE(bufferEnd - bufferStart <= MAX_CHUNK_HEADER_SIZE, "invalid HTTP chunk size");
          maxBytes = kj::min(maxBytes, MAX_CHUNK_HEADER_SIZE);
        }

        readPromise = inner.read(headerBuffer.begin() + bufferEnd, 1, maxBytes);
      }

      auto amount = co_await readPromise;

      if (lineBreakBeforeNextHeader) {
        // Hackily deal with expected leading line break.
        if (bufferEnd == bufferStart && headerBuffer[bufferEnd] == '\r') {
          ++bufferEnd;
          --amount;
        }

        if (amount > 0 && headerBuffer[bufferEnd] == '\n') {
          lineBreakBeforeNextHeader = false;
          ++bufferEnd;
          --amount;

          // Cut the leading line break out of the buffer entirely.
          bufferStart = bufferEnd;
        }

        if (amount == 0) {
          continue;
        }
      }

      size_t pos = bufferEnd;
      size_t newEnd = pos + amount;

      for (;;) {
        // Search for next newline.
        char* nl = reinterpret_cast<char*>(
            memchr(headerBuffer.begin() + pos, '\n', newEnd - pos));
        if (nl == nullptr) {
          // No newline found. Wait for more data.
          bufferEnd = newEnd;
          break;
        }

        // Is this newline which we found the last of the header? For a chunk header, always. For
        // a message header, we search for two newlines in a row. We accept either "\r\n" or just
        // "\n" as a newline sequence (though the standard requires "\r\n").
        if (type == HeaderType::CHUNK ||
            (nl - headerBuffer.begin() >= 4 &&
             ((nl[-1] == '\r' && nl[-2] == '\n') || (nl[-1] == '\n')))) {
          // OK, we've got all the data!

          size_t endIndex = nl + 1 - headerBuffer.begin();
          size_t leftoverStart = endIndex;

          // Strip off the last newline from end.
          endIndex -= 1 + (nl[-1] == '\r');

          if (type == HeaderType::MESSAGE) {
            if (headerBuffer.size() - newEnd < MAX_CHUNK_HEADER_SIZE) {
              // Ugh, there's not enough space for the secondary await buffer. Grow once more.
              auto newBuffer = kj::heapArray<char>(headerBuffer.size() * 2);
              memcpy(newBuffer.begin(), headerBuffer.begin(), headerBuffer.size());
              headerBuffer = kj::mv(newBuffer);
            }
            messageHeaderEnd = endIndex;
          } else {
            // For some reason, HTTP specifies that there will be a line break after each chunk.
            lineBreakBeforeNextHeader = true;
          }

          auto result = headerBuffer.slice(bufferStart, endIndex);
          leftover = headerBuffer.slice(leftoverStart, newEnd);
          co_return result;
        } else {
          pos = nl - headerBuffer.begin() + 1;
        }
      }

      // If we're here, we broke out of the inner loop because we need to read more data.
    }
  }